

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
          (View<int,_true,_std::allocator<unsigned_long>_> *this)

{
  marray_detail::Assert<bool>(this->data_ != (pointer)0x0);
  return (this->geometry_).dimension_;
}

Assistant:

inline const std::size_t
View<T, isConst, A>::dimension() const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || this->data_ != 0);
    return geometry_.dimension();
}